

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_read_buf_callback
                  (mz_zip_archive *pZip,char *pArchive_name,mz_file_read_func read_callback,
                  void *callback_opaque,mz_uint64 max_size,time_t *pFile_time,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  size_t sVar2;
  undefined1 uVar3;
  mz_bool mVar4;
  int iVar5;
  tdefl_status tVar6;
  mz_uint32 mVar7;
  mz_uint64 *pmVar8;
  size_t sVar9;
  mz_uint8 *ptr;
  tdefl_compressor *d;
  size_t sVar10;
  undefined4 extraout_var;
  uint uVar11;
  tdefl_flush flush;
  undefined4 uVar12;
  mz_uint64 *pmVar13;
  mz_uint64 mVar14;
  mz_uint64 *pComp_size;
  mz_uint64 *pmVar15;
  mz_uint8 *pExtra;
  uint uVar16;
  undefined4 uVar17;
  mz_uint64 mVar18;
  mz_uint64 mVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  uint local_12c;
  mz_uint64 local_128;
  mz_ulong local_120;
  void *local_118;
  mz_uint64 local_110;
  mz_file_read_func local_108;
  mz_uint8 *local_100;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  uint local_e4;
  size_t local_e0;
  ulong local_d8;
  int local_cc;
  undefined1 local_c8 [6];
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 uStack_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined8 uStack_b2;
  mz_uint64 local_dir_header_ofs;
  int local_94;
  char *local_90;
  mz_zip_writer_add_state state;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  local_128 = pZip->m_archive_size;
  uncomp_size = 0;
  uVar11 = 6;
  if (-1 < (int)level_and_flags) {
    uVar11 = level_and_flags;
  }
  comp_size = 0;
  uVar22 = uVar11 & 0x20000;
  uVar16 = uVar22 >> 0xe ^ 8;
  local_e4 = uVar16 + 0x800;
  if ((uVar11 >> 0x10 & 1) != 0) {
    local_e4 = uVar16;
  }
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (local_12c = uVar11 & 0xf, pComment == (void *)0x0 && comment_size != 0 || 10 < local_12c)) {
LAB_0010be1b:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    return 0;
  }
  if ((max_size >> 0x20 != 0) && (pmVar1->m_zip64 == 0)) {
    pmVar1->m_zip64 = 1;
  }
  if ((uVar11 >> 10 & 1) != 0) goto LAB_0010be1b;
  if (*pArchive_name == '/') {
LAB_0010be7b:
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
      return 0;
    }
    return 0;
  }
  if (pmVar1->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
    return 0;
  }
  local_118 = callback_opaque;
  local_110 = max_size;
  local_108 = read_callback;
  local_90 = pArchive_name;
  local_e0 = strlen(pArchive_name);
  if (0xffff < local_e0) goto LAB_0010be7b;
  iVar20 = (int)pZip->m_file_offset_alignment;
  uVar11 = iVar20 - 1;
  uVar21 = (ulong)(iVar20 - (uVar11 & (uint)local_128) & uVar11);
  if (pZip->m_file_offset_alignment == 0) {
    uVar21 = 0;
  }
  sVar9 = (pmVar1->m_central_dir).m_size;
  if (0xfffffffe < local_e0 + comment_size + sVar9 + 0x4a) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
      return 0;
    }
    return 0;
  }
  if ((pmVar1->m_zip64 == 0) &&
     (uVar21 + user_extra_data_central_len + local_128 +
               (ulong)user_extra_data_len + (ulong)comment_size + local_e0 * 2 + sVar9 + 0x472 >>
      0x20 != 0)) {
    pmVar1->m_zip64 = 1;
  }
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
  }
  mVar19 = local_128;
  if (local_110 < 4) {
    local_12c = 0;
  }
  mVar4 = mz_zip_writer_write_zeros(pZip,local_128,(mz_uint32)uVar21);
  sVar2 = local_e0;
  if (mVar4 == 0) goto LAB_0010c9e9;
  uVar21 = mVar19 + uVar21;
  local_dir_header_ofs = uVar21;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar21) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/miniz.h",
                  0x2290,
                  "mz_bool mz_zip_writer_add_read_buf_callback(mz_zip_archive *, const char *, mz_file_read_func, void *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, mz_uint32, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  iVar20 = (uint)(local_12c != 0) << 3;
  uStack_b8 = 0;
  uStack_b7 = 0;
  uStack_b6 = 0;
  uStack_b5 = 0;
  uStack_b4 = 0;
  uStack_b3 = 0;
  uStack_b2 = 0;
  _local_c8 = 0;
  uStack_c0 = 0;
  uStack_bf = 0;
  uStack_be = 0;
  uStack_bd = 0;
  uStack_bc = 0;
  uStack_bb = 0;
  uStack_ba = 0;
  uStack_b9 = 0;
  if (pmVar1->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar21 >> 0x20 != 0)) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
        return 0;
      }
      return 0;
    }
    uVar3 = 0x14;
    if (local_12c == 0) {
      uVar3 = 0;
    }
    local_c8._0_5_ = CONCAT14(uVar3,0x4034b50);
    local_c8 = (undefined1  [6])CONCAT15(0,local_c8._0_5_);
    _local_c8 = CONCAT16((char)local_e4,local_c8);
    _local_c8 = CONCAT17((char)(local_e4 >> 8),_local_c8);
    uStack_bf = 0;
    uStack_be = (undefined1)dos_time;
    uStack_bd = (undefined1)(dos_time >> 8);
    uStack_bc = (undefined1)dos_date;
    uStack_bb = (undefined1)(dos_date >> 8);
    uStack_ba = 0;
    uStack_b9 = 0;
    uStack_b8 = 0;
    uStack_b7 = 0;
    uStack_b6 = 0;
    uStack_b5 = 0;
    uStack_b4 = 0;
    uStack_b3 = 0;
    uStack_b2 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_e0)) << 0x20;
    uStack_c0 = (char)iVar20;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21,local_c8,0x1e);
    if (sVar9 != 0x1e) goto LAB_0010c9e9;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21 + 0x1e,local_90,sVar2);
    if (sVar9 != sVar2) goto LAB_0010c9e9;
    mVar19 = uVar21 + 0x1e + sVar2;
    pExtra = (mz_uint8 *)0x0;
    local_d8 = 0;
  }
  else {
    if ((local_110 < 0xffffffff) && (uVar21 < 0xffffffff)) {
      local_100 = (mz_uint8 *)0x0;
      local_d8 = 0;
    }
    else {
      pmVar8 = (mz_uint64 *)0x0;
      pmVar13 = &local_dir_header_ofs;
      if (uVar22 == 0) {
        if (uVar21 < 0xffffffff) {
          pmVar13 = pmVar8;
        }
        pmVar15 = (mz_uint64 *)0x0;
        pComp_size = (mz_uint64 *)0x0;
      }
      else {
        pmVar15 = &uncomp_size;
        if (local_110 < 0xffffffff) {
          pmVar15 = pmVar8;
        }
        pComp_size = &comp_size;
        if (local_110 < 0xffffffff) {
          pComp_size = pmVar8;
        }
        if (uVar21 < 0xffffffff) {
          pmVar13 = pmVar8;
        }
      }
      local_100 = extra_data;
      mVar7 = mz_zip_writer_create_zip64_extra_data(local_100,pmVar15,pComp_size,pmVar13);
      local_d8 = (ulong)mVar7;
    }
    sVar2 = local_e0;
    uVar3 = 0x14;
    if (local_12c == 0) {
      uVar3 = 0;
    }
    local_c8._0_5_ = CONCAT14(uVar3,0x4034b50);
    local_c8 = (undefined1  [6])CONCAT15(0,local_c8._0_5_);
    _local_c8 = CONCAT16((char)local_e4,local_c8);
    _local_c8 = CONCAT17((char)(local_e4 >> 8),_local_c8);
    uStack_bf = 0;
    uStack_be = (undefined1)dos_time;
    uStack_bd = (undefined1)(dos_time >> 8);
    uStack_bc = (undefined1)dos_date;
    uStack_bb = (undefined1)(dos_date >> 8);
    iVar5 = (int)local_d8 + user_extra_data_len;
    uStack_ba = 0;
    uStack_b9 = 0;
    uStack_b8 = 0;
    uStack_b7 = 0;
    uStack_b6 = 0;
    uStack_b5 = 0;
    uStack_b4 = 0;
    uStack_b3 = 0;
    uStack_b2 = (ulong)CONCAT13((char)((uint)iVar5 >> 8),CONCAT12((char)iVar5,(short)local_e0)) <<
                0x20;
    uStack_c0 = (char)iVar20;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21,local_c8,0x1e);
    if (sVar9 != 0x1e) goto LAB_0010c9e9;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21 + 0x1e,local_90,sVar2);
    if (sVar9 != sVar2) goto LAB_0010c9e9;
    mVar19 = uVar21 + 0x1e + sVar2;
    uVar21 = local_d8 & 0xffffffff;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19,extra_data,uVar21);
    if (sVar9 != uVar21) goto LAB_0010c9e9;
    mVar19 = mVar19 + uVar21;
    pExtra = local_100;
  }
  if (user_extra_data_len != 0) {
    uVar21 = (ulong)user_extra_data_len;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19,user_extra_data,uVar21);
    if (sVar9 != uVar21) goto LAB_0010c9e9;
    mVar19 = mVar19 + uVar21;
  }
  if (local_110 == 0) {
    local_120 = 0;
  }
  else {
    local_128 = mVar19;
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (ptr == (mz_uint8 *)0x0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      bVar23 = false;
      local_120 = 0;
    }
    else {
      local_100 = pExtra;
      local_cc = iVar20;
      if (local_12c == 0) {
        local_120 = 0;
        mVar19 = 0;
        do {
          sVar9 = (*local_108)(local_118,mVar19,ptr,0x10000);
          if (sVar9 == 0) {
            iVar5 = 3;
LAB_0010c523:
            bVar23 = false;
            mVar18 = mVar19;
          }
          else {
            if ((0x10000 < sVar9) || (mVar18 = sVar9 + mVar19, local_110 < mVar18)) {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
              iVar5 = 1;
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              }
              goto LAB_0010c523;
            }
            sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_128,ptr,sVar9);
            if (sVar10 != sVar9) {
              (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
              iVar5 = 1;
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
              }
              goto LAB_0010c523;
            }
            local_120 = mz_crc32(local_120 & 0xffffffff,ptr,sVar9);
            local_128 = local_128 + sVar9;
            iVar5 = 0;
            bVar23 = true;
          }
          mVar19 = mVar18;
        } while (iVar5 == 0);
        pExtra = local_100;
        iVar20 = local_cc;
        if (iVar5 == 3) goto LAB_0010c5cf;
      }
      else {
        d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
        if (d == (tdefl_compressor *)0x0) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
          }
          bVar23 = false;
          local_120 = 0;
        }
        else {
          state.m_cur_archive_file_ofs = local_128;
          uVar21 = 10;
          if ((int)local_12c < 10) {
            uVar21 = (ulong)local_12c;
          }
          state.m_comp_size = 0;
          state.m_pZip = pZip;
          tdefl_init(d,mz_zip_writer_add_put_buf_callback,&state,
                     (uint)(local_12c < 4) << 0xe |
                     tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar21]);
          local_120 = 0;
          local_94 = 0;
          mVar19 = 0;
          do {
            sVar9 = (*local_108)(local_118,mVar19,ptr,0x10000);
            if ((sVar9 < 0x10001) && (uVar21 = sVar9 + mVar19, uVar21 <= local_110)) {
              local_120 = mz_crc32(local_120 & 0xffffffff,ptr,sVar9);
              if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
                flush = TDEFL_NO_FLUSH;
              }
              else {
                mVar4 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
                flush = (uint)(mVar4 != 0) * 3;
              }
              if (sVar9 == 0) {
                flush = TDEFL_FINISH;
              }
              tVar6 = tdefl_compress_buffer(d,ptr,sVar9,flush);
              if (tVar6 == TDEFL_STATUS_OKAY) {
                bVar23 = true;
              }
              else if (tVar6 == TDEFL_STATUS_DONE) {
                bVar23 = false;
                local_94 = 1;
              }
              else {
                if (pZip != (mz_zip_archive *)0x0) {
                  pZip->m_last_error = MZ_ZIP_COMPRESSION_FAILED;
                }
                bVar23 = false;
              }
            }
            else {
              if (pZip != (mz_zip_archive *)0x0) {
                pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
              }
              bVar23 = false;
              uVar21 = mVar19;
            }
            mVar19 = uVar21;
          } while (bVar23);
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,d);
          if (local_94 == 0) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
            bVar23 = false;
          }
          else {
            local_128 = state.m_cur_archive_file_ofs;
            comp_size = state.m_comp_size;
            bVar23 = true;
            uncomp_size = uVar21;
          }
        }
        mVar18 = comp_size;
        mVar19 = uncomp_size;
        if (bVar23) {
LAB_0010c5cf:
          uncomp_size = mVar19;
          comp_size = mVar18;
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
          bVar23 = true;
          pExtra = local_100;
          iVar20 = local_cc;
        }
        else {
          bVar23 = false;
          pExtra = local_100;
          iVar20 = local_cc;
        }
      }
    }
    mVar19 = local_128;
    if (!bVar23) {
      return 0;
    }
  }
  mVar18 = state.m_cur_archive_file_ofs;
  if (uVar22 == 0) {
    state.m_pZip = (mz_zip_archive *)
                   CONCAT17((char)(local_120 >> 0x18),
                            CONCAT16((char)(local_120 >> 0x10),
                                     CONCAT15((char)(local_120 >> 8),
                                              CONCAT14((char)local_120,0x8074b50))));
    uVar3 = (undefined1)(uncomp_size >> 0x18);
    if (pExtra == (mz_uint8 *)0x0) {
      if (comp_size >> 0x20 == 0) {
        pmVar13 = &state.m_cur_archive_file_ofs;
        state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar18,7);
        state.m_cur_archive_file_ofs._0_7_ =
             CONCAT16((char)(uncomp_size >> 0x10),
                      CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)))
        ;
        sVar9 = 0x10;
        goto LAB_0010c6e3;
      }
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      }
      bVar23 = false;
    }
    else {
      pmVar13 = &state.m_comp_size;
      state.m_cur_archive_file_ofs = comp_size;
      state.m_comp_size._0_7_ = (undefined7)uncomp_size;
      uVar3 = (undefined1)(uncomp_size >> 0x38);
      sVar9 = 0x18;
LAB_0010c6e3:
      *(undefined1 *)((long)pmVar13 + 7) = uVar3;
      sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19,&state,sVar9);
      bVar23 = sVar10 == sVar9;
      sVar10 = 0;
      if (bVar23) {
        sVar10 = sVar9;
      }
      mVar19 = mVar19 + sVar10;
    }
    if (!bVar23) {
      return 0;
    }
  }
  local_128 = mVar19;
  if (uVar22 != 0) {
    local_100 = pExtra;
    if (pExtra != (mz_uint8 *)0x0) {
      pmVar13 = (mz_uint64 *)0x0;
      pmVar8 = &uncomp_size;
      if (local_110 < 0xffffffff) {
        pmVar8 = pmVar13;
      }
      pmVar15 = &comp_size;
      if (local_110 < 0xffffffff) {
        pmVar15 = pmVar13;
      }
      if (0xfffffffe < local_dir_header_ofs) {
        pmVar13 = &local_dir_header_ofs;
      }
      mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar8,pmVar15,pmVar13);
      local_d8 = (ulong)mVar7;
    }
    mVar19 = local_dir_header_ofs;
    iVar5 = user_extra_data_len + (int)local_d8;
    mVar18 = uncomp_size;
    if (0xfffffffe < uncomp_size) {
      mVar18 = 0xffffffff;
    }
    mVar14 = 0xffffffff;
    if (comp_size < 0xffffffff) {
      mVar14 = comp_size;
    }
    uVar3 = 0x14;
    if (local_12c == 0) {
      uVar3 = 0;
    }
    local_c8._0_5_ = CONCAT14(uVar3,0x4034b50);
    local_c8 = (undefined1  [6])CONCAT15(0,local_c8._0_5_);
    _local_c8 = CONCAT16((char)local_e4,local_c8);
    _local_c8 = CONCAT17((char)(local_e4 >> 8),_local_c8);
    uStack_c0 = (undefined1)iVar20;
    uStack_bf = 0;
    uStack_be = (undefined1)dos_time;
    uStack_bd = (undefined1)(dos_time >> 8);
    uStack_bc = (undefined1)dos_date;
    uStack_bb = (undefined1)(dos_date >> 8);
    uStack_b8 = (undefined1)(local_120 >> 0x10);
    uStack_ba = (undefined1)local_120;
    uStack_b9 = (undefined1)(local_120 >> 8);
    uVar12 = (int)mVar14;
    if (0xfffffffe < local_110) {
      uVar12 = 0xffffffff;
    }
    uStack_b7 = (undefined1)(local_120 >> 0x18);
    uVar17 = (int)mVar18;
    if (0xfffffffe < local_110) {
      uVar17 = 0xffffffff;
    }
    uStack_b6 = (undefined1)uVar12;
    uStack_b5 = (undefined1)((uint)uVar12 >> 8);
    uStack_b4 = (undefined1)((uint)uVar12 >> 0x10);
    uStack_b3 = (undefined1)((uint)uVar12 >> 0x18);
    uStack_b2 = CONCAT17((char)((uint)iVar5 >> 8),
                         CONCAT16((char)iVar5,
                                  CONCAT15((char)(local_e0 >> 8),CONCAT14((char)local_e0,uVar17))));
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_dir_header_ofs,local_c8,0x1e);
    sVar2 = local_e0;
    if (sVar9 != 0x1e) {
LAB_0010c9e9:
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
        return 0;
      }
      return 0;
    }
    pExtra = local_100;
    if (local_100 != (mz_uint8 *)0x0) {
      sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19 + 0x1e,local_90,local_e0);
      if ((sVar9 != sVar2) ||
         (uVar21 = local_d8 & 0xffffffff,
         sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19 + 0x1e + local_e0,extra_data,uVar21),
         pExtra = local_100, sVar9 != uVar21)) goto LAB_0010c9e9;
    }
  }
  if (pExtra != (mz_uint8 *)0x0) {
    pmVar13 = (mz_uint64 *)0x0;
    pmVar8 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar8 = pmVar13;
    }
    pmVar15 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar15 = pmVar13;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar13 = &local_dir_header_ofs;
    }
    mVar7 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar8,pmVar15,pmVar13);
    local_d8 = CONCAT44(extraout_var,mVar7);
  }
  mVar4 = mz_zip_writer_add_to_central_dir
                    (pZip,local_90,(mz_uint16)local_e0,pExtra,(mz_uint16)local_d8,pComment,
                     comment_size,uncomp_size,comp_size,(mz_uint32)local_120,(mz_uint16)iVar20,
                     (mz_uint16)local_e4,dos_time,dos_date,local_dir_header_ofs,ext_attributes,
                     user_extra_data_central,user_extra_data_central_len);
  if (mVar4 == 0) {
    return 0;
  }
  pZip->m_total_files = pZip->m_total_files + 1;
  pZip->m_archive_size = local_128;
  return 1;
}

Assistant:

mz_bool mz_zip_writer_add_read_buf_callback(
    mz_zip_archive *pZip, const char *pArchive_name,
    mz_file_read_func read_callback, void *callback_opaque, mz_uint64 max_size,
    const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size,
    mz_uint level_and_flags, mz_uint32 ext_attributes,
    const char *user_extra_data, mz_uint user_extra_data_len,
    const char *user_extra_data_central, mz_uint user_extra_data_central_len) {
  mz_uint16 gen_flags;
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size,
                                  uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  mz_uint8 *pExtra_data = NULL;
  mz_uint32 extra_size = 0;
  mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
  mz_zip_internal_state *pState;
  mz_uint64 file_ofs = 0, cur_archive_header_file_ofs;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  gen_flags = (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
                  ? 0
                  : MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;

  if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
    gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

  /* Sanity checks */
  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) ||
      ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  pState = pZip->m_pState;

  if ((!pState->m_zip64) && (max_size > MZ_UINT32_MAX)) {
    /* Source file is too large for non-zip64 */
    /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    pState->m_zip64 = MZ_TRUE;
  }

  /* We could support this, but why? */
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  if (pState->m_zip64) {
    if (pZip->m_total_files == MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
  } else {
    if (pZip->m_total_files == MZ_UINT16_MAX) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
    }
  }

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > MZ_UINT16_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size +
       MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!pState->m_zip64) {
    /* Bail early if the archive would obviously become too large */
    if ((pZip->m_archive_size + num_alignment_padding_bytes +
         MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size +
         MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size +
         user_extra_data_len + pState->m_central_dir.m_size +
         MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024 +
         MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) >
        0xFFFFFFFF) {
      pState->m_zip64 = MZ_TRUE;
      /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
    }
  }

#ifndef MINIZ_NO_TIME
  if (pFile_time) {
    mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
  }
#else
  (void)pFile_time;
#endif

  if (max_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes)) {
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
  }

  cur_archive_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_archive_file_ofs;

  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (max_size && level) {
    method = MZ_DEFLATED;
  }

  MZ_CLEAR_ARR(local_dir_header);
  if (pState->m_zip64) {
    if (max_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX) {
      pExtra_data = extra_data;
      if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
            (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
      else
        extra_size = mz_zip_writer_create_zip64_extra_data(
            extra_data, NULL, NULL,
            (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                    : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method,
            gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data,
                       extra_size) != extra_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += extra_size;
  } else {
    if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
      return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)user_extra_data_len, 0, 0, 0, method, gen_flags,
            dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += sizeof(local_dir_header);

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                       archive_name_size) != archive_name_size) {
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += archive_name_size;
  }

  if (user_extra_data_len > 0) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       user_extra_data,
                       user_extra_data_len) != user_extra_data_len)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_archive_file_ofs += user_extra_data_len;
  }

  if (max_size) {
    void *pRead_buf =
        pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (!level) {
      while (1) {
        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if (n == 0)
          break;

        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf,
                           n) != n) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
        cur_archive_file_ofs += n;
      }
      uncomp_size = file_ofs;
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(
          pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                     tdefl_create_comp_flags_from_zip_params(
                         level, -15, MZ_DEFAULT_STRATEGY)) !=
          TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
      }

      for (;;) {
        tdefl_status status;
        tdefl_flush flush = TDEFL_NO_FLUSH;

        size_t n = read_callback(callback_opaque, file_ofs, pRead_buf,
                                 MZ_ZIP_MAX_IO_BUF_SIZE);
        if ((n > MZ_ZIP_MAX_IO_BUF_SIZE) || (file_ofs + n > max_size)) {
          mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
          break;
        }

        file_ofs += n;
        uncomp_crc32 =
            (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);

        if (pZip->m_pNeeds_keepalive != NULL &&
            pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
          flush = TDEFL_FULL_FLUSH;

        if (n == 0)
          flush = TDEFL_FINISH;

        status = tdefl_compress_buffer(pComp, pRead_buf, n, flush);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY) {
          mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
          break;
        }
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        return MZ_FALSE;
      }

      uncomp_size = file_ofs;
      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  if (!(level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE)) {
    mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
    mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

    MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
    MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
    if (pExtra_data == NULL) {
      if (comp_size > MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

      MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
    } else {
      MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
      MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
      local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
    }

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs,
                       local_dir_footer,
                       local_dir_footer_size) != local_dir_footer_size)
      return MZ_FALSE;

    cur_archive_file_ofs += local_dir_footer_size;
  }

  if (level_and_flags & MZ_ZIP_FLAG_WRITE_HEADER_SET_SIZE) {
    if (pExtra_data != NULL) {
      extra_size = mz_zip_writer_create_zip64_extra_data(
          extra_data, (max_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
          (max_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
          (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs
                                                  : NULL);
    }

    if (!mz_zip_writer_create_local_dir_header(
            pZip, local_dir_header, (mz_uint16)archive_name_size,
            (mz_uint16)(extra_size + user_extra_data_len),
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : uncomp_size,
            (max_size >= MZ_UINT32_MAX) ? MZ_UINT32_MAX : comp_size,
            uncomp_crc32, method, gen_flags, dos_time, dos_date))
      return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    cur_archive_header_file_ofs = local_dir_header_ofs;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                       local_dir_header,
                       sizeof(local_dir_header)) != sizeof(local_dir_header))
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    if (pExtra_data != NULL) {
      cur_archive_header_file_ofs += sizeof(local_dir_header);

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         pArchive_name,
                         archive_name_size) != archive_name_size) {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
      }

      cur_archive_header_file_ofs += archive_name_size;

      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_header_file_ofs,
                         extra_data, extra_size) != extra_size)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

      cur_archive_header_file_ofs += extra_size;
    }
  }

  if (pExtra_data != NULL) {
    extra_size = mz_zip_writer_create_zip64_extra_data(
        extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
        (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL,
        (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
  }

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data,
          (mz_uint16)extra_size, pComment, comment_size, uncomp_size, comp_size,
          uncomp_crc32, method, gen_flags, dos_time, dos_date,
          local_dir_header_ofs, ext_attributes, user_extra_data_central,
          user_extra_data_central_len))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}